

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

string * __thiscall
cmFindLibraryCommand::FindFrameworkLibraryNamesPerDir_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  bool bVar1;
  reference a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  allocator<char> local_d2;
  byte local_d1;
  string local_d0;
  uint local_ac;
  byte local_a5;
  string local_98;
  reference local_78;
  string *n;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *d;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string fwPath;
  cmFindLibraryCommand *this_local;
  string *finalPath;
  
  fwPath.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&__range1);
  pvVar2 = &(this->super_cmFindBase).super_cmFindCommon.SearchPaths;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar2);
  d = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&d), bVar1) {
    a = __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end1);
    pvVar2 = &(this->super_cmFindBase).Names;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar2);
    n = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&n), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[13]>
                (&local_98,a,local_78,(char (*) [13])".xcframework");
      std::__cxx11::string::operator=((string *)&__range1,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&__range1);
      if (bVar1) {
        local_a5 = 0;
        cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,(string *)&__range1);
        bVar1 = cmFindBase::Validate(&this->super_cmFindBase,__return_storage_ptr__);
        if (bVar1) {
          local_a5 = 1;
        }
        local_ac = (uint)bVar1;
        if ((local_a5 & 1) == 0) {
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        if (local_ac != 0) goto LAB_00321f6b;
      }
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[11]>
                (&local_d0,a,local_78,(char (*) [11])".framework");
      std::__cxx11::string::operator=((string *)&__range1,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&__range1);
      if (bVar1) {
        local_d1 = 0;
        cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,(string *)&__range1);
        bVar1 = cmFindBase::Validate(&this->super_cmFindBase,__return_storage_ptr__);
        if (bVar1) {
          local_d1 = 1;
        }
        local_ac = (uint)bVar1;
        if ((local_d1 & 1) == 0) {
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        if (local_ac != 0) goto LAB_00321f6b;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_d2);
  std::allocator<char>::~allocator(&local_d2);
  local_ac = 1;
LAB_00321f6b:
  std::__cxx11::string::~string((string *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindFrameworkLibraryNamesPerDir()
{
  std::string fwPath;
  // Search for all names in each search path.
  for (std::string const& d : this->SearchPaths) {
    for (std::string const& n : this->Names) {
      fwPath = cmStrCat(d, n, ".xcframework");
      if (cmSystemTools::FileIsDirectory(fwPath)) {
        auto finalPath = cmSystemTools::CollapseFullPath(fwPath);
        if (this->Validate(finalPath)) {
          return finalPath;
        }
      }

      fwPath = cmStrCat(d, n, ".framework");
      if (cmSystemTools::FileIsDirectory(fwPath)) {
        auto finalPath = cmSystemTools::CollapseFullPath(fwPath);
        if (this->Validate(finalPath)) {
          return finalPath;
        }
      }
    }
  }

  // No framework found.
  return "";
}